

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * print_array(cJSON *item,int depth,int fmt,printbuffer *p)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  int iVar3;
  cJSON *pcVar4;
  char *pcVar5;
  size_t sVar6;
  undefined8 *__s_00;
  long lVar7;
  int iVar8;
  size_t sVar9;
  char *__dest;
  ulong uVar10;
  undefined8 *puVar11;
  ulong uVar12;
  cJSON **ppcVar13;
  ulong uVar14;
  int local_38;
  
  ppcVar13 = &item->child;
  sVar9 = 0xfffffffffffffff8;
  uVar10 = 0;
  pcVar4 = (cJSON *)ppcVar13;
  do {
    pcVar4 = pcVar4->next;
    uVar10 = uVar10 - 1;
    sVar9 = sVar9 + 8;
  } while (pcVar4 != (cJSON *)0x0);
  if ((int)uVar10 == -1) {
    if (p == (printbuffer *)0x0) {
      pcVar5 = (char *)(*cJSON_malloc)(3);
    }
    else {
      pcVar5 = ensure(p,3);
    }
    if (pcVar5 != (char *)0x0) {
      pcVar5[2] = '\0';
      pcVar5[0] = '[';
      pcVar5[1] = ']';
    }
  }
  else {
    if (p == (printbuffer *)0x0) {
      __s_00 = (undefined8 *)(*cJSON_malloc)(sVar9);
      if (__s_00 != (undefined8 *)0x0) {
        bVar2 = false;
        memset(__s_00,0,sVar9);
        pcVar4 = *ppcVar13;
        if (pcVar4 == (cJSON *)0x0) {
          bVar2 = true;
          sVar9 = 5;
          bVar1 = true;
        }
        else {
          local_38 = 3 - (uint)(fmt == 0);
          iVar8 = 5;
          puVar11 = __s_00;
          do {
            pcVar5 = print_value(pcVar4,depth + 1,fmt,(printbuffer *)0x0);
            *puVar11 = pcVar5;
            if (pcVar5 == (char *)0x0) {
              bVar2 = true;
            }
            else {
              sVar6 = strlen(pcVar5);
              iVar8 = iVar8 + local_38 + (int)sVar6;
            }
            pcVar4 = pcVar4->next;
            bVar1 = !bVar2;
          } while ((pcVar4 != (cJSON *)0x0) && (puVar11 = puVar11 + 1, !bVar2));
          sVar9 = (size_t)iVar8;
          bVar2 = !bVar2;
        }
        if (bVar1) {
          pcVar5 = (char *)(*cJSON_malloc)(sVar9);
        }
        else {
          pcVar5 = (char *)0x0;
        }
        uVar14 = ~uVar10;
        if ((bool)(pcVar5 != (char *)0x0 & bVar2)) {
          pcVar5[0] = '[';
          pcVar5[1] = '\0';
          __dest = pcVar5 + 1;
          uVar12 = 0;
          do {
            __s = (char *)__s_00[uVar12];
            sVar6 = strlen(__s);
            memcpy(__dest,__s,sVar6);
            __dest = __dest + sVar6;
            if (-(int)uVar10 - 2 != uVar12) {
              *__dest = ',';
              if (fmt == 0) {
                __dest = __dest + 1;
              }
              else {
                __dest[1] = ' ';
                __dest = __dest + 2;
              }
              *__dest = '\0';
            }
            (*cJSON_free)((void *)__s_00[uVar12]);
            uVar12 = uVar12 + 1;
          } while (uVar14 + (uVar14 == 0) != uVar12);
          (*cJSON_free)(__s_00);
          __dest[0] = ']';
          __dest[1] = '\0';
          return pcVar5;
        }
        lVar7 = 0;
        do {
          if ((void *)__s_00[lVar7] != (void *)0x0) {
            (*cJSON_free)((void *)__s_00[lVar7]);
          }
          lVar7 = lVar7 + 1;
        } while (uVar14 + (uVar14 == 0) != lVar7);
        (*cJSON_free)(__s_00);
      }
    }
    else {
      iVar8 = p->offset;
      pcVar5 = ensure(p,1);
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '[';
        p->offset = p->offset + 1;
        pcVar4 = *ppcVar13;
        if (pcVar4 != (cJSON *)0x0) {
          do {
            print_value(pcVar4,depth + 1,fmt,p);
            iVar3 = 0;
            if (p->buffer != (char *)0x0) {
              iVar3 = p->offset;
              sVar6 = strlen(p->buffer + iVar3);
              iVar3 = (int)sVar6 + iVar3;
            }
            p->offset = iVar3;
            if (pcVar4->next != (cJSON *)0x0) {
              pcVar5 = ensure(p,fmt == 0 ^ 3);
              if (pcVar5 == (char *)0x0) goto LAB_00108b23;
              *pcVar5 = ',';
              if (fmt == 0) {
                pcVar5 = pcVar5 + 1;
              }
              else {
                pcVar5[1] = ' ';
                pcVar5 = pcVar5 + 2;
              }
              *pcVar5 = '\0';
              p->offset = p->offset + (2 - (uint)(fmt == 0));
            }
            pcVar4 = pcVar4->next;
          } while (pcVar4 != (cJSON *)0x0);
        }
        pcVar5 = ensure(p,2);
        if (pcVar5 != (char *)0x0) {
          pcVar5[0] = ']';
          pcVar5[1] = '\0';
          return p->buffer + iVar8;
        }
      }
    }
LAB_00108b23:
    pcVar5 = (char *)0x0;
  }
  return pcVar5;
}

Assistant:

static char *print_array(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char **entries;
	char *out=0,*ptr,*ret;int len=5;
	cJSON *child=item->child;
	int numentries=0,i=0,fail=0;
	size_t tmplen=0;
	
	/* How many entries in the array? */
	while (child) numentries++,child=child->next;
	/* Explicitly handle numentries==0 */
	if (!numentries)
	{
		if (p)	out=ensure(p,3);
		else	out=(char*)cJSON_malloc(3);
		if (out) strcpy(out,"[]");
		return out;
	}

	if (p)
	{
		/* Compose the output array. */
		i=p->offset;
		ptr=ensure(p,1);if (!ptr) return 0;	*ptr='[';	p->offset++;
		child=item->child;
		while (child && !fail)
		{
			print_value(child,depth+1,fmt,p);
			p->offset=update(p);
			if (child->next) {len=fmt?2:1;ptr=ensure(p,len+1);if (!ptr) return 0;*ptr++=',';if(fmt)*ptr++=' ';*ptr=0;p->offset+=len;}
			child=child->next;
		}
		ptr=ensure(p,2);if (!ptr) return 0;	*ptr++=']';*ptr=0;
		out=(p->buffer)+i;
	}
	else
	{
		/* Allocate an array to hold the values for each */
		entries=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!entries) return 0;
		memset(entries,0,numentries*sizeof(char*));
		/* Retrieve all the results: */
		child=item->child;
		while (child && !fail)
		{
			ret=print_value(child,depth+1,fmt,0);
			entries[i++]=ret;
			if (ret) len+=strlen(ret)+2+(fmt?1:0); else fail=1;
			child=child->next;
		}
		
		/* If we didn't fail, try to malloc the output string */
		if (!fail)	out=(char*)cJSON_malloc(len);
		/* If that fails, we fail. */
		if (!out) fail=1;

		/* Handle failure. */
		if (fail)
		{
			for (i=0;i<numentries;i++) if (entries[i]) cJSON_free(entries[i]);
			cJSON_free(entries);
			return 0;
		}
		
		/* Compose the output array. */
		*out='[';
		ptr=out+1;*ptr=0;
		for (i=0;i<numentries;i++)
		{
			tmplen=strlen(entries[i]);memcpy(ptr,entries[i],tmplen);ptr+=tmplen;
			if (i!=numentries-1) {*ptr++=',';if(fmt)*ptr++=' ';*ptr=0;}
			cJSON_free(entries[i]);
		}
		cJSON_free(entries);
		*ptr++=']';*ptr++=0;
	}
	return out;	
}